

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)

{
  pthread_mutex_t *__mutex;
  int MyRank;
  uint reversePeer;
  int iVar1;
  RegisterQueue __ptr;
  _ReaderRegisterMsg *p_Var2;
  SstStream p_Var3;
  SstStream s;
  CPTimestepList p_Var4;
  ssize_t *psVar5;
  WS_ReaderInfo reader;
  int *piVar6;
  CP_PeerConnection *pCVar7;
  attr_list p_Var8;
  DP_WSR_Stream pvVar9;
  undefined8 uVar10;
  CMConnection p_Var11;
  WS_ReaderInfo *pp_Var12;
  void **__ptr_00;
  long lVar13;
  int **forwardArray;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  ssize_t Ret;
  CMConnection *pp_Var17;
  long *plVar18;
  long lVar19;
  char cVar20;
  void *free_block;
  int *reverseArray;
  void *ret_data_block;
  void *DP_WriterInfo;
  ssize_t GlobalStartingTimestep;
  int GlobalSuccess;
  int MySuccess;
  _CP_DP_PairInfo combined_init;
  _CP_WriterInitInfo cpInfo;
  int local_c4;
  CMConnection local_c0;
  void *local_b0;
  undefined8 local_a8;
  SstParams p_Stack_a0;
  void **local_98;
  WS_ReaderInfo p_Stack_90;
  void *local_88;
  void *local_78;
  void *local_70;
  void **local_68;
  int local_60;
  undefined4 local_5c;
  char **local_58;
  void *local_50;
  char *local_48;
  WS_ReaderInfo p_Stack_40;
  long local_38;
  
  local_b0 = (void *)0x0;
  reader = (WS_ReaderInfo)malloc(0x90);
  CP_verbose(Stream,PerRankVerbose,"Beginning writer-side reader open protocol\n");
  if (Stream->Rank == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
    __ptr = Stream->ReaderRegisterQueue;
    Stream->ReaderRegisterQueue = __ptr->Next;
    __ptr->Next = (_RegisterQueue *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
    p_Var2 = __ptr->Msg;
    local_a8 = (int *)(ulong)(uint)p_Var2->ReaderCohortSize;
    p_Stack_a0 = (SstParams)p_Var2->CP_ReaderInfo;
    local_98 = p_Var2->DP_ReaderInfo;
    local_88 = (void *)(ulong)p_Var2->SpecPreload;
    p_Stack_90 = reader;
    piVar6 = (int *)CP_distributeDataFromRankZero
                              (Stream,&local_a8,Stream->CPInfo->CombinedReaderInfoFormat,&local_b0);
    local_c0 = __ptr->Conn;
    local_c4 = __ptr->Msg->WriterResponseCondition;
    CMreturn_buffer(Stream->CPInfo->SharedCM->cm);
    free(__ptr);
  }
  else {
    local_c0 = (CMConnection)0x0;
    piVar6 = (int *)CP_distributeDataFromRankZero
                              (Stream,(void *)0x0,Stream->CPInfo->CombinedReaderInfoFormat,&local_b0
                              );
    local_c4 = -1;
  }
  iVar15 = *piVar6;
  pCVar7 = (CP_PeerConnection *)calloc(0x18,(long)iVar15);
  if (0 < (long)iVar15) {
    pp_Var17 = &pCVar7->CMconn;
    lVar19 = 0;
    do {
      p_Var8 = (attr_list)
               attr_list_from_string(**(undefined8 **)(*(long *)(piVar6 + 2) + lVar19 * 8));
      ((CP_PeerConnection *)(pp_Var17 + -2))->ContactList = p_Var8;
      pp_Var17[-1] = (CMConnection)*(void **)(*(long *)(*(long *)(piVar6 + 2) + lVar19 * 8) + 8);
      if ((lVar19 == 0) && (local_c0 != (CMConnection)0x0)) {
        CMConnection_add_reference(local_c0);
        *pp_Var17 = local_c0;
        CMconn_register_close_handler(local_c0,WriterConnCloseHandler,reader);
      }
      else {
        *pp_Var17 = (CMConnection)0x0;
      }
      lVar19 = lVar19 + 1;
      iVar15 = *piVar6;
      pp_Var17 = pp_Var17 + 3;
    } while (lVar19 < iVar15);
  }
  pvVar9 = (*Stream->DP_Interface->initWriterPerReader)
                     (&Svcs,Stream->DP_Stream,iVar15,pCVar7,*(void ***)(piVar6 + 4),&local_70);
  memset(reader,0,0x90);
  reader->RankZeroID = *(void **)(piVar6 + 6);
  reader->DP_WSR_Stream = pvVar9;
  reader->ParentStream = Stream;
  reader->LastReleasedTimestep = -1;
  reader->Connections = pCVar7;
  reader->LocalReaderDefinitionsLocked = 0;
  reader->FullCommPatternLocked = 0;
  reader->CommPatternLockTimestep = -1;
  reader->ReaderStatus = Opening;
  if (piVar6[8] == 1) {
    reader->PreloadMode = SstPreloadSpeculative;
    reader->PreloadModeActiveTimestep = 0;
    CP_verbose(Stream,PerStepVerbose,"Setting SpeculativePreload ON for new reader\n");
  }
  iVar15 = *piVar6;
  plVar18 = *(long **)(piVar6 + 2);
  p_Var3 = reader->ParentStream;
  MyRank = p_Var3->Rank;
  iVar16 = p_Var3->CohortSize;
  reader->ReaderCohortSize = iVar15;
  if (reader->Connections == (CP_PeerConnection *)0x0) {
    pCVar7 = (CP_PeerConnection *)calloc(0x18,(long)iVar15);
    reader->Connections = pCVar7;
  }
  if (0 < iVar15) {
    lVar19 = 0;
    do {
      if (*(long *)((long)&reader->Connections->ContactList + lVar19) == 0) {
        uVar10 = attr_list_from_string(*(undefined8 *)*plVar18);
        *(undefined8 *)((long)&reader->Connections->ContactList + lVar19) = uVar10;
      }
      *(undefined8 *)((long)&reader->Connections->RemoteStreamID + lVar19) =
           *(undefined8 *)(*plVar18 + 8);
      lVar19 = lVar19 + 0x18;
      plVar18 = plVar18 + 1;
    } while ((long)iVar15 * 0x18 != lVar19);
  }
  if (p_Var3->ConfigParams->CPCommPattern == 1) {
    forwardArray = &reader->Peers;
    getPeerArrays(iVar16,MyRank,iVar15,forwardArray,(int **)&local_a8);
    iVar15 = 0;
    do {
      reversePeer = local_a8[iVar15];
      lVar19 = (long)(int)reversePeer;
      if (lVar19 == -1) {
        free(local_a8);
        iVar15 = **forwardArray;
        uVar14 = 1;
        if (iVar15 == -1) goto LAB_0010feb5;
        iVar16 = 0;
        goto LAB_0010fd55;
      }
      iVar16 = reader->ParentStream->ConnectionUsleepMultiplier;
      if (iVar16 != 0) {
        usleep(iVar16 * MyRank);
      }
      if (reader->Connections[lVar19].CMconn == (CMConnection)0x0) {
        p_Var11 = Tunneling_get_conn(reader->ParentStream->CPInfo->SharedCM->cm,
                                     reader->Connections[lVar19].ContactList);
        reader->Connections[lVar19].CMconn = p_Var11;
      }
      p_Var11 = reader->Connections[lVar19].CMconn;
      if (p_Var11 == (CMConnection)0x0) {
        CP_error(reader->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n");
        s = reader->ParentStream;
        uVar10 = attr_list_to_string(reader->Connections[lVar19].ContactList);
        CP_error(s,"%s\n",uVar10);
      }
      else {
        CP_verbose(p_Var3,TraceVerbose,"Registering a close handler for connection %p, to peer %d\n"
                   ,p_Var11,(ulong)reversePeer);
        CMconn_register_close_handler
                  (reader->Connections[lVar19].CMconn,WriterConnCloseHandler,reader);
        CP_verbose(reader->ParentStream,TraceVerbose,"Sending peer setup to rank %d\n");
        iVar16 = -1;
        if (iVar15 == 0) {
          iVar16 = reader->ParentStream->Rank;
        }
        SendPeerSetupMsg(reader,reversePeer,iVar16);
        iVar15 = iVar15 + 1;
      }
    } while (p_Var11 != (CMConnection)0x0);
LAB_0010fcc4:
    uVar14 = 0;
  }
  else {
    uVar14 = 1;
    if (p_Var3->Rank == 0) {
      if (reader->Connections->CMconn == (CMConnection)0x0) {
        p_Var11 = Tunneling_get_conn(reader->ParentStream->CPInfo->SharedCM->cm,
                                     reader->Connections->ContactList);
        reader->Connections->CMconn = p_Var11;
      }
      p_Var11 = reader->Connections->CMconn;
      if (p_Var11 == (CMConnection)0x0) {
        uVar14 = 0;
        CP_error(reader->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n");
        p_Var3 = reader->ParentStream;
        uVar10 = attr_list_to_string(reader->Connections->ContactList);
        CP_error(p_Var3,"%s\n",uVar10);
      }
      else {
        CMconn_register_close_handler(p_Var11,WriterConnCloseHandler,reader);
      }
    }
  }
LAB_0010feb5:
  local_60 = 0;
  local_5c = uVar14;
  SMPI_Allreduce(&local_5c,&local_60,1,SMPI_INT,SMPI_LAND,Stream->mpiComm);
  if (local_60 == 0) {
    reader = (WS_ReaderInfo)0x0;
  }
  else {
    AddToLastCallFreeList(reader);
    free(local_b0);
    __mutex = &Stream->DataLock;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    pp_Var12 = (WS_ReaderInfo *)realloc(Stream->Readers,(long)Stream->ReaderCount * 8 + 8);
    Stream->Readers = pp_Var12;
    iVar15 = Stream->ReaderCount;
    pp_Var12[iVar15] = reader;
    Stream->ReaderCount = iVar15 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_48 = (char *)0x0;
    p_Stack_40 = (WS_ReaderInfo)0x0;
    local_48 = CP_GetContactString(Stream,(attr_list)0x0);
    local_50 = local_70;
    lVar19 = Stream->WriterTimestep;
    p_Var4 = Stream->QueuedTimesteps;
    local_58 = &local_48;
    p_Stack_40 = reader;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while (p_Var4 != (CPTimestepList)0x0) {
      CP_verbose(Stream,TraceVerbose,
                 "Earliest available : Writer-side Timestep %ld now has reference count %d, expired %d, precious %d\n"
                 ,p_Var4->Timestep,(ulong)(uint)p_Var4->ReferenceCount,(ulong)(uint)p_Var4->Expired,
                 p_Var4->PreciousTimestep);
      psVar5 = &p_Var4->Timestep;
      p_Var4 = p_Var4->Next;
      if (*psVar5 < lVar19) {
        lVar19 = *psVar5;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_38 = 0;
    if (lVar19 != -1) {
      local_38 = lVar19;
    }
    SMPI_Allreduce(&local_38,&local_68,1,SMPI_LONG,SMPI_MAX,Stream->mpiComm);
    CP_verbose(Stream,TraceVerbose,"My oldest timestep was %zd, global oldest timestep was %zd\n",
               local_38,local_68);
    reader->StartingTimestep = (ssize_t)local_68;
    __ptr_00 = CP_consolidateDataToRankZero
                         (Stream,&local_58,Stream->CPInfo->PerRankWriterInfoFormat,&local_78);
    if (Stream->Rank == 0) {
      p_Stack_90 = (WS_ReaderInfo)0x0;
      local_88 = (void *)0x0;
      lVar19 = (long)Stream->CohortSize;
      local_a8 = (int *)CONCAT44(Stream->CohortSize,local_c4);
      p_Stack_a0 = Stream->ConfigParams;
      local_98 = local_68;
      p_Stack_90 = (WS_ReaderInfo)malloc(lVar19 * 8);
      local_88 = malloc(lVar19 * 8);
      if (0 < lVar19) {
        lVar13 = 0;
        do {
          (&p_Stack_90->ParentStream)[lVar13] = *__ptr_00[lVar13];
          *(undefined8 *)((long)local_88 + lVar13 * 8) = *(undefined8 *)((long)__ptr_00[lVar13] + 8)
          ;
          lVar13 = lVar13 + 1;
        } while (lVar19 != lVar13);
      }
      iVar15 = CMwrite(local_c0,Stream->CPInfo->SharedCM->WriterResponseFormat,&local_a8);
      if (iVar15 != 1) {
        CP_verbose(Stream,CriticalVerbose,
                   "Message failed to send to reader in participate in reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n"
                  );
      }
      free(p_Stack_90);
      free(local_88);
    }
    free(local_48);
    if (local_78 != (void *)0x0) {
      free(local_78);
    }
    if (__ptr_00 != (void **)0x0) {
      free(__ptr_00);
    }
    CP_verbose(Stream,PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, reader ready response pending\n"
               ,reader);
  }
  return reader;
  while (iVar15 = (*forwardArray)[iVar16], iVar15 != -1) {
LAB_0010fd55:
    if (reader->Connections[iVar15].CMconn == (CMConnection)0x0) {
      iVar1 = reader->ParentStream->ConnectionUsleepMultiplier;
      if (iVar1 != 0) {
        usleep(iVar1 * MyRank);
      }
      p_Var11 = Tunneling_get_conn(reader->ParentStream->CPInfo->SharedCM->cm,
                                   reader->Connections[iVar15].ContactList);
      reader->Connections[iVar15].CMconn = p_Var11;
      cVar20 = p_Var11 == (CMConnection)0x0;
      if ((bool)cVar20) {
        CP_error(reader->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n");
        p_Var3 = reader->ParentStream;
        uVar10 = attr_list_to_string(reader->Connections[iVar15].ContactList);
        CP_error(p_Var3,"%s\n",uVar10);
      }
      else {
        CMconn_register_close_handler(p_Var11,WriterConnCloseHandler,reader);
        CP_verbose(reader->ParentStream,TraceVerbose,"Sending peer setup to rank %d\n");
        SendPeerSetupMsg(reader,iVar15,reader->ParentStream->Rank);
        iVar16 = iVar16 + 1;
      }
    }
    else {
      iVar16 = iVar16 + 1;
      cVar20 = '\a';
    }
    if ((cVar20 != '\a') && (cVar20 != '\0')) goto LAB_0010fcc4;
  }
  goto LAB_0010feb5;
}

Assistant:

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)
{
    RegisterQueue Req;
    reader_data_t ReturnData;
    void *free_block = NULL;
    int WriterResponseCondition = -1;
    CMConnection conn = NULL;
    ssize_t MyStartingTimestep, GlobalStartingTimestep;
    WS_ReaderInfo CP_WSR_Stream = malloc(sizeof(*CP_WSR_Stream));

    CP_verbose(Stream, PerRankVerbose, "Beginning writer-side reader open protocol\n");
    if (Stream->Rank == 0)
    {
        STREAM_MUTEX_LOCK(Stream);
        assert((Stream->ReaderRegisterQueue));
        Req = Stream->ReaderRegisterQueue;
        Stream->ReaderRegisterQueue = Req->Next;
        Req->Next = NULL;
        STREAM_MUTEX_UNLOCK(Stream);
        struct _CombinedReaderInfo reader_data;
        memset(&reader_data, 0, sizeof(reader_data));
        reader_data.ReaderCohortSize = Req->Msg->ReaderCohortSize;
        reader_data.CP_ReaderInfo = Req->Msg->CP_ReaderInfo;
        reader_data.DP_ReaderInfo = Req->Msg->DP_ReaderInfo;
        reader_data.RankZeroID = CP_WSR_Stream;
        reader_data.SpecPreload = Req->Msg->SpecPreload;
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &reader_data, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
        WriterResponseCondition = Req->Msg->WriterResponseCondition;
        conn = Req->Conn;
        CMreturn_buffer(Stream->CPInfo->SharedCM->cm, Req->Msg);
        free(Req);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
    }
    //    printf("I am writer rank %d, my info on readers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_reader_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    DP_WSR_Stream per_reader_Stream;
    void *DP_WriterInfo;
    void *ret_data_block;
    CP_PeerConnection *connections_to_reader;
    connections_to_reader = calloc(sizeof(CP_PeerConnection), ReturnData->ReaderCohortSize);
    for (int i = 0; i < ReturnData->ReaderCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_ReaderInfo[i]->ContactInfo);
        connections_to_reader[i].ContactList = attrs;
        connections_to_reader[i].RemoteStreamID = ReturnData->CP_ReaderInfo[i]->ReaderID;
        if ((i == 0) && (conn != NULL))
        {
            // reuse existing connection to reader rank 0
            // (only not NULL if this is writer rank 0)
            CMConnection_add_reference(conn);
            connections_to_reader[i].CMconn = conn;
            CMconn_register_close_handler(conn, WriterConnCloseHandler, (void *)CP_WSR_Stream);
        }
        else
        {
            connections_to_reader[i].CMconn = NULL;
        }
    }

    per_reader_Stream = Stream->DP_Interface->initWriterPerReader(
        &Svcs, Stream->DP_Stream, ReturnData->ReaderCohortSize, connections_to_reader,
        ReturnData->DP_ReaderInfo, &DP_WriterInfo);

    memset(CP_WSR_Stream, 0, sizeof(*CP_WSR_Stream));
    CP_WSR_Stream->ReaderStatus = NotOpen;
    CP_WSR_Stream->RankZeroID = ReturnData->RankZeroID;

    CP_WSR_Stream->DP_WSR_Stream = per_reader_Stream;
    CP_WSR_Stream->ParentStream = Stream;
    CP_WSR_Stream->LastReleasedTimestep = -1;
    CP_WSR_Stream->Connections = connections_to_reader;
    CP_WSR_Stream->LocalReaderDefinitionsLocked = 0;
    CP_WSR_Stream->FullCommPatternLocked = 0;
    CP_WSR_Stream->CommPatternLockTimestep = -1;
    CP_WSR_Stream->ReaderStatus = Opening;
    if (ReturnData->SpecPreload == SpecPreloadOn)
    {

        CP_WSR_Stream->PreloadMode = SstPreloadSpeculative;
        CP_WSR_Stream->PreloadModeActiveTimestep = 0;
        CP_verbose(Stream, PerStepVerbose, "Setting SpeculativePreload ON for new reader\n");
    }

    int MySuccess =
        initWSReader(CP_WSR_Stream, ReturnData->ReaderCohortSize, ReturnData->CP_ReaderInfo);

    int GlobalSuccess = 0;
    SMPI_Allreduce(&MySuccess, &GlobalSuccess, 1, SMPI_INT, SMPI_LAND, Stream->mpiComm);

    if (!GlobalSuccess)
    {
        return NULL;
    }
    AddToLastCallFreeList(CP_WSR_Stream);
    free(free_block);
    ReturnData = NULL; /* now invalid */

    STREAM_MUTEX_LOCK(Stream);
    Stream->Readers =
        realloc(Stream->Readers, sizeof(Stream->Readers[0]) * (Stream->ReaderCount + 1));
    Stream->Readers[Stream->ReaderCount] = CP_WSR_Stream;
    Stream->ReaderCount++;
    STREAM_MUTEX_UNLOCK(Stream);

    struct _CP_DP_PairInfo combined_init;
    struct _CP_WriterInitInfo cpInfo;

    struct _CP_DP_PairInfo **pointers = NULL;

    memset(&cpInfo, 0, sizeof(cpInfo));
    cpInfo.ContactInfo = CP_GetContactString(Stream, NULL);
    cpInfo.WriterID = CP_WSR_Stream;

    combined_init.CP_Info = (void **)&cpInfo;
    combined_init.DP_Info = DP_WriterInfo;

    MyStartingTimestep = earliestAvailableTimestepNumber(Stream, Stream->WriterTimestep);
    if (MyStartingTimestep == -1)
        MyStartingTimestep = 0;

    SMPI_Allreduce(&MyStartingTimestep, &GlobalStartingTimestep, 1, SMPI_LONG, SMPI_MAX,
                   Stream->mpiComm);

    CP_verbose(Stream, TraceVerbose, "My oldest timestep was %zd, global oldest timestep was %zd\n",
               MyStartingTimestep, GlobalStartingTimestep);

    CP_WSR_Stream->StartingTimestep = GlobalStartingTimestep;

    pointers = (struct _CP_DP_PairInfo **)CP_consolidateDataToRankZero(
        Stream, &combined_init, Stream->CPInfo->PerRankWriterInfoFormat, &ret_data_block);

    if (Stream->Rank == 0)
    {
        struct _WriterResponseMsg response;
        memset(&response, 0, sizeof(response));
        response.WriterResponseCondition = WriterResponseCondition;
        response.WriterCohortSize = Stream->CohortSize;
        response.WriterConfigParams = Stream->ConfigParams;
        response.NextStepNumber = GlobalStartingTimestep;
        response.CP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        response.DP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        for (int i = 0; i < response.WriterCohortSize; i++)
        {
            response.CP_WriterInfo[i] = (struct _CP_WriterInitInfo *)pointers[i]->CP_Info;
            response.DP_WriterInfo[i] = pointers[i]->DP_Info;
        }
        STREAM_ASSERT_UNLOCKED(Stream);
        if (CMwrite(conn, Stream->CPInfo->SharedCM->WriterResponseFormat, &response) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to reader in participate in "
                       "reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
        }
        free(response.CP_WriterInfo);
        free(response.DP_WriterInfo);
    }
    free(cpInfo.ContactInfo);
    if (ret_data_block)
        free(ret_data_block);
    if (pointers)
        free(pointers);
    CP_verbose(Stream, PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, "
               "reader ready response pending\n",
               CP_WSR_Stream);
    return CP_WSR_Stream;
}